

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O2

string * __thiscall
cmFilePathChecksum::getPart
          (string *__return_storage_ptr__,cmFilePathChecksum *this,string *filePath,size_t length)

{
  string sStack_38;
  
  get(&sStack_38,this,filePath);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFilePathChecksum::getPart(const std::string& filePath,
                                        size_t length) const
{
  return get(filePath).substr(0, length);
}